

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseException.h
# Opt level: O0

void __thiscall
AutoArgParse::ParseException::ParseException
          (ParseException *this,ParseFailureReason failureReason,string *errorMessage)

{
  string *errorMessage_local;
  ParseFailureReason failureReason_local;
  ParseException *this_local;
  
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__ParseException_001239c8;
  this->failureReason = failureReason;
  std::__cxx11::string::string((string *)&this->errorMessage,(string *)errorMessage);
  return;
}

Assistant:

ParseException(ParseFailureReason failureReason, std::string errorMessage)
        : failureReason(failureReason), errorMessage(errorMessage) {}